

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

Gia_Man_t * Abc_NtkDeriveFlatGia(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Gia_Man_t *p;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                  ,0x109,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == 0) {
    Abc_NtkFillTemp(pNtk);
    p = Gia_ManStart(0x10000);
    pcVar2 = Abc_UtilStrsav(pNtk->pName);
    p->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(pNtk->pSpec);
    p->pSpec = pcVar2;
    Gia_ManHashAlloc(p);
    for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar5);
      iVar1 = Gia_ManAppendCi(p);
      *(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray] + 0x40) = iVar1;
    }
    Abc_NtkDeriveFlatGia_rec(p,pNtk);
    for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkPo(pNtk,iVar5);
      Gia_ManAppendCo(p,*(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40
                                ));
    }
    Gia_ManHashStop(p);
    Gia_ManSetRegNum(p,0);
    pGVar4 = Gia_ManCleanup(p);
    Gia_ManStop(p);
    return pGVar4;
  }
  __assert_fail("!Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                ,0x10a,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia( Abc_Ntk_t * pNtk )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Abc_Obj_t * pTerm;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Abc_NtkDeriveFlatGia_rec( pGia, pNtk );
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}